

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O3

void ZXing::DataMatrix::C40Encoder::WriteNextTriplet(EncoderContext *context,string *buffer)

{
  char *pcVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  
  uVar2 = buffer->_M_string_length;
  if (uVar2 == 0) {
    uVar5 = 0;
    uVar2 = 0;
  }
  else if (uVar2 == 1) {
    uVar5 = 1;
    uVar2 = 1;
  }
  else {
    if (2 < uVar2) {
      pcVar1 = (buffer->_M_dataplus)._M_p;
      iVar4 = *pcVar1 * 0x640 + pcVar1[1] * 0x28;
      iVar3 = pcVar1[2] + iVar4 + 1;
      iVar4 = pcVar1[2] + iVar4 + 0x100;
      if (-1 < iVar3) {
        iVar4 = iVar3;
      }
      EncoderContext::addCodeword(context,(uint8_t)((uint)iVar4 >> 8));
      EncoderContext::addCodeword(context,(uint8_t)iVar3);
      std::__cxx11::string::erase((ulong)buffer,0);
      return;
    }
    uVar5 = 2;
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar2);
}

Assistant:

static void WriteNextTriplet(EncoderContext& context, std::string& buffer)
	{
		EncodeToCodewords(context, buffer, 0);
		buffer.erase(0, 3);
	}